

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O0

void __thiscall brown::Tile::drawrectfill(Tile *this,int x0,int y0,int x1,int y1,uint32_t col)

{
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_38;
  uint32_t *lptr;
  int local_28;
  int y;
  int x;
  uint32_t col_local;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  Tile *this_local;
  
  local_44 = x0;
  if (x0 < 1) {
    local_44 = 0;
  }
  local_48 = x1;
  if (this->x <= x1) {
    local_48 = this->x;
  }
  if (local_44 < local_48) {
    local_4c = y0;
    if (y0 < 1) {
      local_4c = 0;
    }
    local_50 = y1;
    if (this->y <= y1) {
      local_50 = this->y;
    }
    if (local_4c < local_50) {
      local_38 = (long)(this->p * local_4c) + this->f;
      for (lptr._4_4_ = local_4c; lptr._4_4_ < local_50; lptr._4_4_ = lptr._4_4_ + 1) {
        for (local_28 = local_44; local_28 < local_48; local_28 = local_28 + 1) {
          *(uint32_t *)(local_38 + (long)local_28 * 4) = col;
        }
        local_38 = local_38 + this->p;
      }
    }
  }
  return;
}

Assistant:

void Tile::drawrectfill (int x0, int y0, int x1, int y1, std::uint32_t col)
{
    int x, y;
    std::uint32_t *lptr;

    x0 = max(x0,0); x1 = min(x1,this->x); if (x0 >= x1) return;
    y0 = max(y0,0); y1 = min(y1,this->y); if (y0 >= y1) return;
    lptr = (std::uint32_t *)(this->p*y0 + this->f);
    for(y=y0;y<y1;y++,lptr=(std::uint32_t *)(((intptr_t)lptr)+this->p))
        for(x=x0;x<x1;x++) lptr[x] = col;
}